

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
geemuboi::test::core::CpuTest_add_hl_sp_half_carry_Test::~CpuTest_add_hl_sp_half_carry_Test
          (CpuTest_add_hl_sp_half_carry_Test *this)

{
  CpuTest::~CpuTest(&this->super_CpuTest);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F(CpuTest, add_hl_sp_half_carry) {
    regs.f = ICpu::Z_FLAG;
    regs.h = 0xF;
    regs.l = 0xFF;
    regs.sp = 1;
    execute_instruction(0x39);

    ICpu::Registers expected_regs{};
    expected_regs.sp = 1;
    expected_regs.h = 0x10;
    expected_regs.f = ICpu::Z_FLAG | ICpu::H_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}